

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

pair<const_llvm::ConstantInt_*,_dg::vr::Relations> __thiscall
dg::vr::ValueRelations::getBound(ValueRelations *this,Handle h,Relations rels)

{
  bool bVar1;
  C lt;
  _Base_ptr p_Var2;
  _Base_bitset<1UL> _Var3;
  C rt;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> pVar4;
  RelationsMap related;
  _Base_bitset<1UL> local_68;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_60;
  
  _Var3._M_w = 0;
  local_68._M_w = (_WordT)rels.bits.super__Base_bitset<1UL>._M_w;
  RelationsGraph<dg::vr::ValueRelations>::getRelated
            ((RelationsMap *)&local_60,&this->graph,h,(Relations *)&local_68,false);
  rt = (C)0x0;
  p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &local_60._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
      ::~_Rb_tree(&local_60);
      pVar4.second.bits.super__Base_bitset<1UL>._M_w = (bitset<12UL>)(bitset<12UL>)_Var3._M_w;
      pVar4.first = rt;
      return pVar4;
    }
    lt = getAnyConst(this,*(Handle *)(p_Var2 + 1));
    if (lt != (C)0x0) {
      if (rt != (C)0x0) {
        bVar1 = compare(lt,(Relations)local_68._M_w,rt);
        if (!bVar1) goto LAB_00140b6a;
      }
      _Var3._M_w = (_WordT)p_Var2[1]._M_parent;
      rt = lt;
    }
LAB_00140b6a:
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

std::pair<ValueRelations::C, Relations>
ValueRelations::getBound(Handle h, Relations rels) const {
    RelationsMap related = graph.getRelated(h, rels);

    C resultC = nullptr;
    Relations resultR;
    for (const auto &pair : related) {
        C c = getAnyConst(pair.first);
        if (c && (!resultC || compare(c, rels, resultC))) {
            resultC = c;
            resultR = pair.second;
        }
    }

    return {resultC, resultR};
}